

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

Id __thiscall spv::Builder::makeStructResultType(Builder *this,Id type0,Id type1)

{
  pointer ppIVar1;
  Instruction *pIVar2;
  Id *pIVar3;
  Id IVar4;
  uint uVar5;
  ulong uVar6;
  Vector<spv::Id> members;
  Id local_30;
  Id local_2c;
  _Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_28;
  
  ppIVar1 = this->groupedTypes[0x1e].
            super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = (uint)((ulong)((long)this->groupedTypes[0x1e].
                               super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar1) >> 3);
  if (0 < (int)uVar5) {
    uVar6 = 0;
    do {
      pIVar2 = ppIVar1[uVar6];
      pIVar3 = (pIVar2->operands).
               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (((((long)*(pointer *)
                    ((long)&(pIVar2->operands).
                            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                            ._M_impl + 8) - (long)pIVar3 & 0x3fffffffcU) == 8) && (*pIVar3 == type0)
          ) && (pIVar3[1] == type1)) {
        return pIVar2->resultId;
      }
      uVar6 = uVar6 + 1;
    } while ((uVar5 & 0x7fffffff) != uVar6);
  }
  local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_finish = (uint *)0x0;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_30 = type1;
  local_2c = type0;
  std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
  _M_realloc_insert<unsigned_int_const&>
            ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&local_28,
             (iterator)0x0,&local_2c);
  if (local_28._M_impl.super__Vector_impl_data._M_finish ==
      local_28._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&local_28,
               (iterator)local_28._M_impl.super__Vector_impl_data._M_finish,&local_30);
  }
  else {
    *local_28._M_impl.super__Vector_impl_data._M_finish = type1;
    local_28._M_impl.super__Vector_impl_data._M_finish =
         local_28._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  IVar4 = makeStructType(this,(Vector<Id> *)&local_28,"ResType");
  std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
            (&local_28);
  return IVar4;
}

Assistant:

Id Builder::makeStructResultType(Id type0, Id type1)
{
    // try to find it
    Instruction* type;
    for (int t = 0; t < (int)groupedTypes[OpTypeStruct].size(); ++t) {
        type = groupedTypes[OpTypeStruct][t];
        if (type->getNumOperands() != 2)
            continue;
        if (type->getIdOperand(0) != type0 ||
            type->getIdOperand(1) != type1)
            continue;
        return type->getResultId();
    }

    // not found, make it
    dxil_spv::Vector<spv::Id> members;
    members.push_back(type0);
    members.push_back(type1);

    return makeStructType(members, "ResType");
}